

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O0

void tsgGenUniformSamples
               (int num_dimensions,int num_samples,double *lower,double *upper,char *random_type,
               int random_seed,tsg_dream_random random_callback,double *samples)

{
  time_t tVar1;
  iterator __first;
  iterator __last;
  int size;
  double *pdVar2;
  uint local_148;
  result_type_conflict local_140;
  function<double_()> local_128;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  undefined1 local_d8 [8];
  vector<double,_std::allocator<double>_> result;
  undefined1 local_a0 [8];
  function<double_()> randgen;
  allocator<char> local_69;
  string local_68 [8];
  string rtype;
  uniform_real_distribution<double> unif;
  minstd_rand park_miller;
  int random_seed_local;
  char *random_type_local;
  double *upper_local;
  double *lower_local;
  int num_samples_local;
  int num_dimensions_local;
  
  pdVar2 = upper;
  if (random_seed == -1) {
    local_140 = time((time_t *)0x0);
  }
  else {
    local_140 = (result_type_conflict)random_seed;
  }
  size = (int)pdVar2;
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             &unif._M_param._M_b,local_140);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)((long)&rtype.field_2 + 8),0.0,1.0);
  local_148 = random_seed;
  if (random_seed == -1) {
    tVar1 = time((time_t *)0x0);
    local_148 = (uint)tVar1;
  }
  srand(local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,random_type,&local_69);
  std::allocator<char>::~allocator(&local_69);
  result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_68;
  tsgGenUniformSamples::anon_class_32_4_11f9070c::operator()
            ((function<double_()> *)local_a0,
             (anon_class_32_4_11f9070c *)
             &result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TasGrid::Utils::copyArray<double_const,int>
            (&local_f0,(Utils *)lower,(double *)(ulong)(uint)num_dimensions,size);
  TasGrid::Utils::copyArray<double_const,int>
            (&local_108,(Utils *)upper,(double *)(ulong)(uint)num_dimensions,size);
  std::function<double_()>::function(&local_128,(function<double_()> *)local_a0);
  TasDREAM::genUniformSamples
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_f0,&local_108,num_samples,
             &local_128);
  std::function<double_()>::~function(&local_128);
  std::vector<double,_std::allocator<double>_>::~vector(&local_108);
  std::vector<double,_std::allocator<double>_>::~vector(&local_f0);
  __first = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_d8);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_d8);
  std::
  copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double*>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current,samples);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_d8);
  std::function<double_()>::~function((function<double_()> *)local_a0);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void tsgGenUniformSamples(int num_dimensions, int num_samples, double const lower[], double const upper[],
                          const char* random_type, int random_seed, tsg_dream_random random_callback, double *samples){

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    std::vector<double> result = TasDREAM::genUniformSamples(Utils::copyArray(lower, num_dimensions),
                                                             Utils::copyArray(upper, num_dimensions),
                                                             num_samples, randgen);
    std::copy(result.begin(), result.end(), samples);
}